

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall stateObservation::LipmDcmEstimator::update(LipmDcmEstimator *this)

{
  double dVar1;
  double dVar2;
  Vector2 clampedLocalBias;
  Vector2 localBias;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  Matrix2 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [16];
  LipmDcmEstimator *local_68;
  Matrix2 *local_60;
  LipmDcmEstimator *local_58;
  undefined1 *local_50;
  
  updateMatricesABQ_(this);
  ZeroDelayObserver::estimateState((ZeroDelayObserver *)&this->filter_);
  if ((0.0 <= (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[0]) ||
     (0.0 <= (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
             m_storage.m_data.array[1])) {
    getLocalBias((LipmDcmEstimator *)local_98);
    dVar1 = (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[0];
    if (0.0 <= dVar1) {
      dVar2 = -dVar1;
      if (-dVar1 <= (double)local_98._0_8_) {
        dVar2 = (double)local_98._0_8_;
      }
      local_a8 = -(ulong)(dVar1 < (double)local_98._0_8_) & (ulong)dVar1 |
                 ~-(ulong)(dVar1 < (double)local_98._0_8_) & (ulong)dVar2;
    }
    dVar1 = (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[1];
    if (0.0 <= dVar1) {
      dVar2 = -dVar1;
      if (-dVar1 <= (double)local_98._8_8_) {
        dVar2 = (double)local_98._8_8_;
      }
      local_a0 = -(ulong)(dVar1 < (double)local_98._8_8_) & (ulong)dVar1 |
                 ~-(ulong)(dVar1 < (double)local_98._8_8_) & (ulong)dVar2;
    }
    local_88 = &this->previousOrientation_;
    local_80 = (undefined1 *)&local_a8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,2,1,0,2,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_68,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
                *)&local_88);
    setBias(this,(Vector2 *)&local_68);
    getUnbiasedDCM((LipmDcmEstimator *)local_78);
    local_68 = (LipmDcmEstimator *)local_78;
    local_60 = &this->previousOrientation_;
    local_58 = (LipmDcmEstimator *)local_98;
    local_50 = (undefined1 *)&local_a8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Product<Eigen::Matrix<double,2,2,0,2,2>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_88,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>_>_>
                *)&local_68);
    setUnbiasedDCM(this,(Vector2 *)&local_88);
  }
  return;
}

Assistant:

void LipmDcmEstimator::update()
{
  updateMatricesABQ_();
  filter_.estimateState();
  if(biasLimit_.x() >= 0 || biasLimit_.y() >= 0)
  {
    Vector2 localBias = getLocalBias();
    Vector2 clampedLocalBias;
    if(biasLimit_.x() >= 0)
    {
      clampedLocalBias.x() = tools::clampScalar(localBias.x(), biasLimit_.x());
    }
    if(biasLimit_.y() >= 0)
    {
      clampedLocalBias.y() = tools::clampScalar(localBias.y(), biasLimit_.y());
    }

    setBias(previousOrientation_ * clampedLocalBias);
    setUnbiasedDCM(getUnbiasedDCM() + previousOrientation_ * (localBias - clampedLocalBias));
  }
}